

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O0

void drawCurvedInner(ostream *out,double x,double y,double width,double height)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double Ry;
  double Rx;
  double d;
  double y2;
  double x2;
  double *w;
  double *h;
  double height_local;
  double width_local;
  double y_local;
  double x_local;
  ostream *out_local;
  
  dVar2 = x + width;
  Rx = 2.0;
  if (width / 3.0 < 2.0) {
    Rx = width / 3.0;
  }
  dVar3 = height / 4.0;
  std::operator<<(out,"\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"");
  poVar1 = std::operator<<(out," M ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + height / 4.0);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + (height * 3.0) / 4.0);
  poVar1 = std::operator<<(out," A ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,Rx);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," 0 0 1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x + Rx);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + height);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2 - Rx);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + height);
  poVar1 = std::operator<<(out," A ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,Rx);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," 0 0 1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + (height * 3.0) / 4.0);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + (height * 3.0) / 4.0);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + height / 4.0);
  poVar1 = std::operator<<(out," A ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,Rx);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," 0 0 1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2 - Rx);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2 - Rx);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x + Rx);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y);
  poVar1 = std::operator<<(out," A ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,Rx);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," 0 0 1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + height / 4.0);
  std::operator<<(out," z\"");
  std::operator<<(out,"/>\n");
  return;
}

Assistant:

void drawCurvedInner(ostream& out, double x, double y, double width, double height) {
	double& h = height;
	double& w = width;
	double x2 = x+w;
	double y2 = y+h;
	double d  = 2.0;
	if (d > w / 3) {
		d = w/3;
	}
	double Rx  = d;
	double Ry  = h/4;

	out << "\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"";
	out << " M "  << x          << " " << y+h/4.0;
	out << " L " << x           << " " << y+h*3.0/4.0;
	out << " A " << Rx << " " << Ry << " 0 0 1 " << x+d << " " << y2;
	out << " L " << x2-d        << " " << y2;
	out << " A " << Rx << " " << Ry << " 0 0 1 " << x2 << " " << y+h*3.0/4.0;
	out << " L " << x2          << " " << y+h*3.0/4.0;
	out << " L " << x2          << " " << y+h/4.0;
	out << " A " << Rx << " " << Ry << " 0 0 1 " << x2-d << " " << y;
	out << " L " << x2-d        << " " << y;
	out << " L " << x+d         << " " << y;
	out << " A " << Rx << " " << Ry << " 0 0 1 " << x << " " << y+h/4.0;
	out << " z\"";
	out << "/>\n";
}